

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neighbor-graph.c
# Opt level: O0

uint32_t mpr_calculate_minimal_d_z_y(nhdp_domain *domain,neighbor_graph *graph,addr_node *y)

{
  list_entity *plVar1;
  oonf_log_source oVar2;
  uint32_t uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  list_entity *__tempptr_2;
  list_entity *__tempptr_1;
  list_entity *__tempptr;
  netaddr_str nbuf2;
  netaddr_str nbuf1;
  n1_node *remember;
  uint32_t min_d_z_y;
  uint32_t d_z_y;
  n1_node *z_node;
  addr_node *y_local;
  neighbor_graph *graph_local;
  nhdp_domain *domain_local;
  
  if (y->min_d_z_y == 0) {
    remember._0_4_ = 0xffffffff;
    nbuf1.buf[0x36] = '\0';
    nbuf1.buf[0x37] = '\0';
    nbuf1.buf[0x38] = '\0';
    nbuf1.buf[0x39] = '\0';
    nbuf1.buf[0x3a] = '\0';
    nbuf1.buf[0x3b] = '\0';
    nbuf1.buf[0x3c] = '\0';
    nbuf1.buf[0x3d] = '\0';
    for (plVar1 = (graph->set_n1).list_head.next; oVar2 = LOG_MPR, _min_d_z_y = &plVar1[-3].prev,
        plVar1->prev != (graph->set_n1).list_head.prev; plVar1 = plVar1->next) {
      uVar3 = (*graph->methods->calculate_d_x_y)(domain,graph,(n1_node *)_min_d_z_y,y);
      if (uVar3 < (uint)remember) {
        nbuf1.buf._54_8_ = _min_d_z_y;
        remember._0_4_ = uVar3;
      }
    }
    if (nbuf1.buf._54_8_ == 0) {
      if (((&log_global_mask)[LOG_MPR] & 1) != 0) {
        uVar4 = netaddr_to_prefixstring(nbuf2.buf + 0x36,y,0);
        oonf_log(1,oVar2,"src/nhdp/mpr/neighbor-graph.c",0xce,0,0,"minimal d_z_y(%s) = infinite",
                 uVar4);
      }
    }
    else if (((&log_global_mask)[LOG_MPR] & 1) != 0) {
      uVar4 = netaddr_to_prefixstring(nbuf2.buf + 0x36,y,0);
      uVar5 = netaddr_to_prefixstring((long)&__tempptr + 4,nbuf1.buf._54_8_,0);
      oonf_log(1,oVar2,"src/nhdp/mpr/neighbor-graph.c",0xcb,0,0,"minimal d_z_y(%s) = %s (cost %u)",
               uVar4,uVar5,(uint)remember);
    }
    y->min_d_z_y = (uint)remember;
    domain_local._4_4_ = (uint)remember;
  }
  else {
    domain_local._4_4_ = y->min_d_z_y;
  }
  return domain_local._4_4_;
}

Assistant:

uint32_t
mpr_calculate_minimal_d_z_y(const struct nhdp_domain *domain, struct neighbor_graph *graph, struct addr_node *y) {
  struct n1_node *z_node;
  uint32_t d_z_y, min_d_z_y;
#ifdef OONF_LOG_DEBUG_INFO
  struct n1_node *remember;
  struct netaddr_str nbuf1, nbuf2;
#endif
  if (y->min_d_z_y) {
    return y->min_d_z_y;
  }

  min_d_z_y = RFC7181_METRIC_INFINITE_PATH;
#ifdef OONF_LOG_DEBUG_INFO
  remember = NULL;
#endif
  avl_for_each_element(&graph->set_n1, z_node, _avl_node) {
    d_z_y = graph->methods->calculate_d_x_y(domain, graph, z_node, y);
    if (d_z_y < min_d_z_y) {
      min_d_z_y = d_z_y;
#ifdef OONF_LOG_DEBUG_INFO
      remember = z_node;
#endif
    }
  }

#ifdef OONF_LOG_DEBUG_INFO
  if (remember) {
    OONF_DEBUG(LOG_MPR, "minimal d_z_y(%s) = %s (cost %u)", netaddr_to_string(&nbuf1, &y->addr),
      netaddr_to_string(&nbuf2, &remember->addr), min_d_z_y);
  }
  else {
    OONF_DEBUG(LOG_MPR, "minimal d_z_y(%s) = infinite", netaddr_to_string(&nbuf1, &y->addr));
  }
#endif
  y->min_d_z_y = min_d_z_y;
  return min_d_z_y;
}